

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::ResolveLinkerWrapper
          (cmGeneratorTarget *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *result,string *language,bool joinItems)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar4;
  pointer pbVar5;
  const_iterator __position;
  int iVar6;
  long *plVar7;
  string *psVar8;
  iterator iVar9;
  long lVar10;
  cmake *this_00;
  undefined7 in_register_00000009;
  size_type *psVar11;
  long lVar12;
  bool bVar13;
  cmMakefile *pcVar14;
  cmMakefile *pcVar15;
  long lVar16;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar17;
  string_view separator;
  string_view sep;
  string_view arg;
  string_view str;
  string SHELL;
  string LINKER;
  string wrapper;
  string value;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string wrapperSep;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wrapperFlag;
  string LINKER_SHELL;
  bool local_1fc;
  value_type local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long *local_188;
  size_t local_180;
  long local_178 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  size_type *local_148;
  size_type local_140;
  size_type local_138;
  undefined8 uStack_130;
  cmGeneratorTarget *local_128;
  undefined4 local_11c;
  undefined1 local_118 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  cmListFileBacktrace local_68;
  const_iterator local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_11c = (undefined4)CONCAT71(in_register_00000009,joinItems);
  pcVar15 = this->Makefile;
  std::operator+(&local_d8,"CMAKE_",language);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d8);
  paVar2 = &local_1f8.Value.field_2;
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1f8.Value.field_2._M_allocated_capacity = *psVar11;
    local_1f8.Value.field_2._8_8_ = plVar7[3];
    local_1f8.Value._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1f8.Value.field_2._M_allocated_capacity = *psVar11;
    local_1f8.Value._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1f8.Value._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  psVar8 = cmMakefile::GetSafeDefinition(pcVar15,&local_1f8.Value);
  local_188 = local_178;
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar3,pcVar3 + psVar8->_M_string_length);
  local_128 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.Value._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.Value._M_dataplus._M_p,
                    local_1f8.Value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  arg._M_str = (char *)local_188;
  arg._M_len = local_180;
  cmExpandedList_abi_cxx11_(&local_a0,arg,false);
  pcVar15 = local_128->Makefile;
  std::operator+(&local_1a8,"CMAKE_",language);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a8);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_1f8.Value.field_2._M_allocated_capacity = *psVar11;
    local_1f8.Value.field_2._8_8_ = plVar7[3];
    local_1f8.Value._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1f8.Value.field_2._M_allocated_capacity = *psVar11;
    local_1f8.Value._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1f8.Value._M_string_length = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  psVar8 = cmMakefile::GetSafeDefinition(pcVar15,&local_1f8.Value);
  pcVar3 = (psVar8->_M_dataplus)._M_p;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,pcVar3,pcVar3 + psVar8->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.Value._M_dataplus._M_p != paVar2) {
    operator_delete(local_1f8.Value._M_dataplus._M_p,
                    local_1f8.Value.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_1fc = true;
  if ((local_a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar6 = std::__cxx11::string::compare
                        ((char *)(local_a0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1)), iVar6 == 0)) {
    pbVar1 = local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    pcVar3 = local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    pbVar5 = local_a0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_a0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar5->field_2) {
      operator_delete(pcVar3,(pbVar5->field_2)._M_allocated_capacity + 1);
    }
    local_1fc = false;
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"LINKER:","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"SHELL:","");
  std::operator+(&local_50,&local_1a8,&local_1c8);
  do {
    pBVar17 = (result->
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pBVar4 = (result->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar16 = (long)pBVar4 - (long)pBVar17;
    lVar12 = (lVar16 >> 4) * -0x5555555555555555 >> 2;
    if (0 < lVar12) {
      lVar12 = lVar12 + 1;
      do {
        iVar6 = std::__cxx11::string::compare((ulong)pBVar17,0,(string *)local_1a8._M_string_length)
        ;
        iVar9._M_current = pBVar17;
        if (iVar6 == 0) goto LAB_004b03ad;
        iVar6 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 1),0,(string *)local_1a8._M_string_length);
        iVar9._M_current = pBVar17 + 1;
        if (iVar6 == 0) goto LAB_004b03ad;
        iVar6 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 2),0,(string *)local_1a8._M_string_length);
        iVar9._M_current = pBVar17 + 2;
        if (iVar6 == 0) goto LAB_004b03ad;
        iVar6 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 3),0,(string *)local_1a8._M_string_length);
        iVar9._M_current = pBVar17 + 3;
        if (iVar6 == 0) goto LAB_004b03ad;
        pBVar17 = pBVar17 + 4;
        lVar12 = lVar12 + -1;
        lVar16 = lVar16 + -0xc0;
      } while (1 < lVar12);
    }
    lVar12 = (lVar16 >> 4) * -0x5555555555555555;
    if (lVar12 == 1) {
LAB_004b0389:
      iVar6 = std::__cxx11::string::compare((ulong)pBVar17,0,(string *)local_1a8._M_string_length);
      iVar9._M_current = pBVar4;
      if (iVar6 == 0) {
        iVar9._M_current = pBVar17;
      }
    }
    else if (lVar12 == 2) {
LAB_004b0365:
      iVar6 = std::__cxx11::string::compare((ulong)pBVar17,0,(string *)local_1a8._M_string_length);
      iVar9._M_current = pBVar17;
      if (iVar6 != 0) {
        pBVar17 = pBVar17 + 1;
        goto LAB_004b0389;
      }
    }
    else {
      iVar9._M_current = pBVar4;
      if ((lVar12 == 3) &&
         (iVar6 = std::__cxx11::string::compare
                            ((ulong)pBVar17,0,(string *)local_1a8._M_string_length),
         iVar9._M_current = pBVar17, iVar6 != 0)) {
        pBVar17 = pBVar17 + 1;
        goto LAB_004b0365;
      }
    }
LAB_004b03ad:
    if (iVar9._M_current ==
        (result->
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) break;
    local_148 = (size_type *)((iVar9._M_current)->Value)._M_dataplus._M_p;
    paVar2 = &((iVar9._M_current)->Value).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148 == paVar2) {
      local_138 = paVar2->_M_allocated_capacity;
      uStack_130 = *(undefined8 *)((long)&((iVar9._M_current)->Value).field_2 + 8);
      local_148 = &local_138;
    }
    else {
      local_138 = paVar2->_M_allocated_capacity;
    }
    local_140 = ((iVar9._M_current)->Value)._M_string_length;
    ((iVar9._M_current)->Value)._M_dataplus._M_p = (pointer)paVar2;
    ((iVar9._M_current)->Value)._M_string_length = 0;
    ((iVar9._M_current)->Value).field_2._M_local_buf[0] = '\0';
    local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = ((iVar9._M_current)->Backtrace).
              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         ((iVar9._M_current)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
         TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    ((iVar9._M_current)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
    TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((iVar9._M_current)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
    TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    iVar9 = std::
            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::_M_erase(result,iVar9);
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = std::__cxx11::string::compare((ulong)&local_148,0,(string *)local_50._M_string_length);
    if (iVar6 == 0) {
      cmSystemTools::ParseUnixCommandLine
                ((char *)((long)local_148 + local_50._M_string_length),&local_168);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&local_148);
      sep._M_str = ",";
      sep._M_len = 1;
      str._M_str = local_1f8.Value._M_dataplus._M_p;
      str._M_len = local_1f8.Value._M_string_length;
      cmTokenize_abi_cxx11_(&local_88,str,sep);
      local_118._16_8_ =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118._8_8_ =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118._0_8_ =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.Value._M_dataplus._M_p != &local_1f8.Value.field_2) {
        operator_delete(local_1f8.Value._M_dataplus._M_p,
                        local_1f8.Value.field_2._M_allocated_capacity + 1);
      }
    }
    pbVar1 = local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar13 = false;
    local_58._M_current = iVar9._M_current;
    if (local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar12 = (long)local_168.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_168.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      pcVar15 = (cmMakefile *)
                local_168.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (lVar12 == 0x20) {
        if ((((deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&(local_168.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->
            super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Deque_impl_data._M_map_size == 0) goto LAB_004b093e;
LAB_004b058d:
        lVar12 = std::__cxx11::string::find((char *)pcVar15,(ulong)local_1c8._M_dataplus._M_p,0);
        pcVar14 = (cmMakefile *)pbVar1;
        if (lVar12 != -1) {
          pcVar14 = pcVar15;
        }
      }
      else {
        if (0 < lVar12 >> 7) {
          lVar16 = (lVar12 >> 7) + 1;
          do {
            lVar10 = std::__cxx11::string::find((char *)pcVar15,(ulong)local_1c8._M_dataplus._M_p,0)
            ;
            pcVar14 = pcVar15;
            if (lVar10 != -1) goto LAB_004b06df;
            pcVar14 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            lVar10 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_1c8._M_dataplus._M_p,0)
            ;
            if (lVar10 != -1) goto LAB_004b06df;
            pcVar14 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last;
            lVar10 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_1c8._M_dataplus._M_p,0)
            ;
            if (lVar10 != -1) goto LAB_004b06df;
            pcVar14 = (cmMakefile *)
                      &(pcVar15->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_parent;
            lVar10 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_1c8._M_dataplus._M_p,0)
            ;
            if (lVar10 != -1) goto LAB_004b06df;
            pcVar15 = (cmMakefile *)&pcVar15->Targets;
            lVar16 = lVar16 + -1;
            lVar12 = lVar12 + -0x80;
          } while (1 < lVar16);
        }
        lVar12 = lVar12 >> 5;
        if (lVar12 == 1) goto LAB_004b058d;
        if (lVar12 == 2) {
LAB_004b06ad:
          lVar12 = std::__cxx11::string::find((char *)pcVar15,(ulong)local_1c8._M_dataplus._M_p,0);
          pcVar14 = pcVar15;
          if (lVar12 == -1) {
            pcVar15 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            goto LAB_004b058d;
          }
        }
        else {
          pcVar14 = (cmMakefile *)pbVar1;
          if ((lVar12 == 3) &&
             (lVar12 = std::__cxx11::string::find
                                 ((char *)pcVar15,(ulong)local_1c8._M_dataplus._M_p,0),
             pcVar14 = pcVar15, lVar12 == -1)) {
            pcVar15 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            goto LAB_004b06ad;
          }
        }
      }
LAB_004b06df:
      if (pcVar14 ==
          (cmMakefile *)
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        anon_unknown.dwarf_1dcce3b::wrapOptions
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_118,&local_168,&local_68,&local_a0,&local_d8,local_1fc);
        __position._M_current = local_58._M_current;
        paVar2 = &local_1f8.Value.field_2;
        if ((char)local_11c == '\0') {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     result,local_58._M_current,local_118._0_8_,local_118._8_8_);
        }
        else {
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
          local_88.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                    ((string *)(local_118 + 0x20),
                     (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&local_88,separator);
          local_b8.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_b8.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._32_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_118 + 0x30)) {
            local_1f8.Value.field_2._8_8_ = local_118._56_8_;
            local_1f8.Value._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1f8.Value._M_dataplus._M_p = (pointer)local_118._32_8_;
          }
          local_1f8.Value.field_2._M_allocated_capacity._1_7_ = local_118._49_7_;
          local_1f8.Value.field_2._M_local_buf[0] = local_118[0x30];
          local_1f8.Value._M_string_length = local_118._40_8_;
          local_118._40_8_ = 0;
          local_118[0x30] = '\0';
          local_1f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_b8.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          local_1f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi =
               local_b8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_b8.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_b8.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_118._32_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_118 + 0x30);
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_insert_rval(result,__position,&local_1f8);
          if (local_1f8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_1f8.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8.Value._M_dataplus._M_p != paVar2) {
            operator_delete(local_1f8.Value._M_dataplus._M_p,
                            local_1f8.Value.field_2._M_allocated_capacity + 1);
          }
          if (local_b8.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b8.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((undefined1 *)local_118._32_8_ != local_118 + 0x30) {
            operator_delete((void *)local_118._32_8_,CONCAT71(local_118._49_7_,local_118[0x30]) + 1)
            ;
          }
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_118);
        bVar13 = false;
      }
      else {
        this_00 = cmLocalGenerator::GetCMakeInstance(local_128->LocalGenerator);
        paVar2 = &local_1f8.Value.field_2;
        local_1f8.Value._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1f8,
                   "\'SHELL:\' prefix is not supported as part of \'LINKER:\' arguments.","");
        GetBacktrace((cmGeneratorTarget *)local_118);
        cmake::IssueMessage(this_00,FATAL_ERROR,&local_1f8.Value,(cmListFileBacktrace *)local_118);
        if ((cmMakefile *)local_118._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8.Value._M_dataplus._M_p != paVar2) {
          operator_delete(local_1f8.Value._M_dataplus._M_p,
                          local_1f8.Value.field_2._M_allocated_capacity + 1);
        }
        bVar13 = true;
      }
    }
LAB_004b093e:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
    if ((_Base_ptr)
        local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_148 != &local_138) {
      operator_delete(local_148,local_138 + 1);
    }
  } while (!bVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  if (local_188 != local_178) {
    operator_delete(local_188,local_178[0] + 1);
  }
  return result;
}

Assistant:

std::vector<BT<std::string>>& cmGeneratorTarget::ResolveLinkerWrapper(
  std::vector<BT<std::string>>& result, const std::string& language,
  bool joinItems) const
{
  // replace "LINKER:" prefixed elements by actual linker wrapper
  const std::string wrapper(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG"
                          : "_LINKER_WRAPPER_FLAG")));
  std::vector<std::string> wrapperFlag = cmExpandedList(wrapper);
  const std::string wrapperSep(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG_SEP"
                          : "_LINKER_WRAPPER_FLAG_SEP")));
  bool concatFlagAndArgs = true;
  if (!wrapperFlag.empty() && wrapperFlag.back() == " ") {
    concatFlagAndArgs = false;
    wrapperFlag.pop_back();
  }

  const std::string LINKER{ "LINKER:" };
  const std::string SHELL{ "SHELL:" };
  const std::string LINKER_SHELL = LINKER + SHELL;

  std::vector<BT<std::string>>::iterator entry;
  while ((entry = std::find_if(result.begin(), result.end(),
                               [&LINKER](BT<std::string> const& item) -> bool {
                                 return item.Value.compare(0, LINKER.length(),
                                                           LINKER) == 0;
                               })) != result.end()) {
    std::string value = std::move(entry->Value);
    cmListFileBacktrace bt = std::move(entry->Backtrace);
    entry = result.erase(entry);

    std::vector<std::string> linkerOptions;
    if (value.compare(0, LINKER_SHELL.length(), LINKER_SHELL) == 0) {
      cmSystemTools::ParseUnixCommandLine(
        value.c_str() + LINKER_SHELL.length(), linkerOptions);
    } else {
      linkerOptions = cmTokenize(value.substr(LINKER.length()), ",");
    }

    if (linkerOptions.empty() ||
        (linkerOptions.size() == 1 && linkerOptions.front().empty())) {
      continue;
    }

    // for now, raise an error if prefix SHELL: is part of arguments
    if (std::find_if(linkerOptions.begin(), linkerOptions.end(),
                     [&SHELL](const std::string& item) -> bool {
                       return item.find(SHELL) != std::string::npos;
                     }) != linkerOptions.end()) {
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "'SHELL:' prefix is not supported as part of 'LINKER:' arguments.",
        this->GetBacktrace());
      return result;
    }

    std::vector<BT<std::string>> options = wrapOptions(
      linkerOptions, bt, wrapperFlag, wrapperSep, concatFlagAndArgs);
    if (joinItems) {
      result.insert(entry,
                    cmJoin(cmRange<decltype(options.cbegin())>(
                             options.cbegin(), options.cend()),
                           " "_s));
    } else {
      result.insert(entry, options.begin(), options.end());
    }
  }
  return result;
}